

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::GeneratedCodeInfo::ByteSizeLong(GeneratedCodeInfo *this)

{
  void **ppvVar1;
  const_iterator cVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar4 = (size_t)*(int *)((long)&this->field_0 + 8);
  ppvVar1 = internal::RepeatedPtrFieldBase::elements
                      ((RepeatedPtrFieldBase *)&(this->field_0)._impl_);
  cVar2 = RepeatedPtrField<google::protobuf::GeneratedCodeInfo_Annotation>::end
                    (&(this->field_0)._impl_.annotation_);
  for (; ppvVar1 != cVar2.it_; ppvVar1 = ppvVar1 + 1) {
    sVar3 = internal::WireFormatLite::MessageSize<google::protobuf::GeneratedCodeInfo_Annotation>
                      ((GeneratedCodeInfo_Annotation *)*ppvVar1);
    sVar4 = sVar4 + sVar3;
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t GeneratedCodeInfo::ByteSizeLong() const {
  const GeneratedCodeInfo& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.GeneratedCodeInfo)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.GeneratedCodeInfo.Annotation annotation = 1;
    {
      total_size += 1UL * this_._internal_annotation_size();
      for (const auto& msg : this_._internal_annotation()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}